

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void PType::StaticInit(void)

{
  PNamedType *pPVar1;
  PType *pPVar2;
  PPointer *this;
  PStruct *pPVar3;
  PField *this_00;
  PSymbolType *pPVar4;
  char *len;
  FName *pFVar5;
  FName local_94;
  FName local_90;
  FName local_8c;
  FName local_88;
  FName local_84;
  FName local_80;
  FName local_7c;
  FName local_78;
  FName local_74;
  FName local_70;
  FName local_6c;
  FName local_68;
  FName local_64;
  FName local_60;
  FName local_5c;
  FName local_58;
  FName local_54;
  FName local_50;
  FName local_4c;
  FName local_48;
  FName local_44;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  FName local_30;
  FName local_2c;
  FName local_28;
  FName local_24;
  FName local_20;
  FName local_1c;
  FName local_18 [4];
  
  len = "ReleaseGlobalSymbols";
  addterm(ReleaseGlobalSymbols,"ReleaseGlobalSymbols");
  *(PClass **)
   &PErrorType::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PErrorType::RegistrationInfo.MyClass;
  *(PClass **)
   &PVoidType::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PVoidType::RegistrationInfo.MyClass;
  *(PClass **)
   &PInt::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PInt::RegistrationInfo.MyClass;
  *(PClass **)
   &PBool::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PBool::RegistrationInfo.MyClass;
  *(PClass **)
   &PFloat::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PFloat::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PString::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PString::RegistrationInfo.MyClass;
  *(PClass **)
   &PName::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PName::RegistrationInfo.MyClass;
  *(PClass **)
   &PSound::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PSound::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PSpriteID::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PSpriteID::RegistrationInfo.MyClass;
  *(PClass **)
   &PTextureID::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PTextureID::RegistrationInfo.MyClass;
  *(PClass **)
   &PColor::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PColor::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PPointer::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PPointer::RegistrationInfo.MyClass;
  *(PClass **)
   &PClassPointer::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PClassPointer::RegistrationInfo.MyClass;
  *(PClass **)
   &PEnum::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PEnum::RegistrationInfo.MyClass;
  *(PClass **)
   &PArray::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PArray::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PDynArray::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PDynArray::RegistrationInfo.MyClass;
  *(PClass **)
   &PMap::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PMap::RegistrationInfo.MyClass;
  *(PClass **)
   &PStruct::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PStruct::RegistrationInfo.MyClass;
  *(PClass **)
   &PNativeStruct::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PNativeStruct::RegistrationInfo.MyClass;
  *(PClass **)
   &PPrototype::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PPrototype::RegistrationInfo.MyClass;
  *(PClass **)
   &PClass::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject = PClass::RegistrationInfo.MyClass
  ;
  *(PClass **)
   &PStatePointer::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PStatePointer::RegistrationInfo.MyClass;
  *(PClass **)
   &PStateLabel::RegistrationInfo.MyClass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
    super_PCompoundType.super_PType.super_PTypeBase.super_DObject =
       PStateLabel::RegistrationInfo.MyClass;
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)len);
  PErrorType::PErrorType((PErrorType *)pPVar2,1);
  TypeError = (PErrorType *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PErrorType::PErrorType((PErrorType *)pPVar2,2);
  TypeAuto = (PErrorType *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PVoidType::PVoidType((PVoidType *)pPVar2);
  TypeVoid = (PVoidType *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PInt::PInt((PInt *)pPVar2,1,false,true);
  TypeSInt8 = (PInt *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PInt::PInt((PInt *)pPVar2,1,true,true);
  TypeUInt8 = (PInt *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PInt::PInt((PInt *)pPVar2,2,false,true);
  TypeSInt16 = (PInt *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PInt::PInt((PInt *)pPVar2,2,true,true);
  TypeUInt16 = (PInt *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PInt::PInt((PInt *)pPVar2,4,false,true);
  TypeSInt32 = (PInt *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PInt::PInt((PInt *)pPVar2,4,true,true);
  TypeUInt32 = (PInt *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PBool::PBool((PBool *)pPVar2);
  TypeBool = (PBool *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PFloat::PFloat((PFloat *)pPVar2,4);
  TypeFloat32 = (PFloat *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PFloat::PFloat((PFloat *)pPVar2,8);
  TypeFloat64 = (PFloat *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PString::PString((PString *)pPVar2);
  TypeString = (PString *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PName::PName((PName *)pPVar2);
  TypeName = (PName *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PSound::PSound((PSound *)pPVar2);
  TypeSound = (PSound *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PColor::PColor((PColor *)pPVar2);
  TypeColor = (PColor *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0xa8,(size_t)pPVar2);
  PStatePointer::PStatePointer((PStatePointer *)pPVar2);
  TypeState = (PStatePointer *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PStateLabel::PStateLabel((PStateLabel *)pPVar2);
  TypeStateLabel = (PStateLabel *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  this = (PPointer *)DObject::operator_new((DObject *)0xa8,(size_t)pPVar2);
  PPointer::PPointer(this);
  TypeNullPtr = this;
  FTypeTable::AddType(&TypeTable,(PType *)this);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)this);
  PSpriteID::PSpriteID((PSpriteID *)pPVar2);
  TypeSpriteID = (PSpriteID *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  pPVar2 = (PType *)DObject::operator_new((DObject *)0x98,(size_t)pPVar2);
  PTextureID::PTextureID((PTextureID *)pPVar2);
  TypeTextureID = (PTextureID *)pPVar2;
  FTypeTable::AddType(&TypeTable,pPVar2);
  FName::FName(local_18,"@ColorStruct");
  TypeColorStruct = NewStruct(local_18,(PTypeBase *)0x0);
  FName::FName(&local_1c,NAME_String);
  TypeStringStruct = &NewNativeStruct(&local_1c,(PTypeBase *)0x0)->super_PStruct;
  pPVar3 = TypeColorStruct;
  FName::FName(&local_20,NAME_b);
  (*(pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar3,&local_20,TypeUInt8,0);
  pPVar3 = TypeColorStruct;
  FName::FName(&local_24,NAME_g);
  (*(pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar3,&local_24,TypeUInt8,0);
  pPVar3 = TypeColorStruct;
  FName::FName(&local_28,NAME_r);
  (*(pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar3,&local_28,TypeUInt8,0);
  pPVar3 = TypeColorStruct;
  pFVar5 = &local_2c;
  FName::FName(pFVar5,NAME_a);
  (*(pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar3,pFVar5,TypeUInt8);
  pPVar3 = (PStruct *)DObject::operator_new((DObject *)0xc0,(size_t)pFVar5);
  FName::FName(&local_30,NAME_Vector2);
  PStruct::PStruct(pPVar3,&local_30,(PTypeBase *)0x0);
  TypeVector2 = pPVar3;
  FName::FName(&local_34,NAME_X);
  (*(pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar3,&local_34,TypeFloat64);
  pPVar3 = TypeVector2;
  FName::FName(&local_38,NAME_Y);
  (*(pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar3,&local_38,TypeFloat64);
  pPVar3 = TypeVector2;
  FTypeTable::AddType(&TypeTable,(PType *)TypeVector2);
  (TypeVector2->super_PNamedType).super_PCompoundType.super_PType.loadOp = ' ';
  (TypeVector2->super_PNamedType).super_PCompoundType.super_PType.storeOp = '3';
  (TypeVector2->super_PNamedType).super_PCompoundType.super_PType.moveOp = '<';
  (TypeVector2->super_PNamedType).super_PCompoundType.super_PType.RegType = '\x01';
  (TypeVector2->super_PNamedType).super_PCompoundType.super_PType.RegCount = '\x02';
  pPVar3 = (PStruct *)DObject::operator_new((DObject *)0xc0,(size_t)pPVar3);
  FName::FName(&local_3c,NAME_Vector3);
  PStruct::PStruct(pPVar3,&local_3c,(PTypeBase *)0x0);
  TypeVector3 = pPVar3;
  FName::FName(&local_40,NAME_X);
  (*(pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar3,&local_40,TypeFloat64);
  pPVar3 = TypeVector3;
  FName::FName(&local_44,NAME_Y);
  (*(pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar3,&local_44,TypeFloat64,0);
  pPVar3 = TypeVector3;
  pFVar5 = &local_48;
  FName::FName(pFVar5,NAME_Z);
  (*(pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
    _vptr_DObject[0x15])(pPVar3,pFVar5,TypeFloat64,0);
  pPVar1 = &TypeVector3->super_PNamedType;
  this_00 = (PField *)DObject::operator_new((DObject *)0x40,(size_t)pFVar5);
  FName::FName(&local_4c,NAME_XY);
  PField::PField(this_00,&local_4c,(PType *)TypeVector2,0x20000,0,0);
  PSymbolTable::AddSymbol(&(pPVar1->super_PCompoundType).super_PType.Symbols,(PSymbol *)this_00);
  pPVar3 = TypeVector3;
  FTypeTable::AddType(&TypeTable,(PType *)TypeVector3);
  (TypeVector3->super_PNamedType).super_PCompoundType.super_PType.loadOp = '\"';
  (TypeVector3->super_PNamedType).super_PCompoundType.super_PType.storeOp = '5';
  (TypeVector3->super_PNamedType).super_PCompoundType.super_PType.moveOp = '=';
  (TypeVector3->super_PNamedType).super_PCompoundType.super_PType.RegType = '\x01';
  (TypeVector3->super_PNamedType).super_PCompoundType.super_PType.RegCount = '\x03';
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar3);
  FName::FName(&local_50,NAME_sByte);
  PSymbolType::PSymbolType(pPVar4,&local_50,(PType *)TypeSInt8);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_54,NAME_Byte);
  PSymbolType::PSymbolType(pPVar4,&local_54,(PType *)TypeUInt8);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_58,NAME_Short);
  PSymbolType::PSymbolType(pPVar4,&local_58,(PType *)TypeSInt16);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_5c,NAME_uShort);
  PSymbolType::PSymbolType(pPVar4,&local_5c,(PType *)TypeUInt16);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_60,NAME_Int);
  PSymbolType::PSymbolType(pPVar4,&local_60,(PType *)TypeSInt32);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_64,NAME_uInt);
  PSymbolType::PSymbolType(pPVar4,&local_64,(PType *)TypeUInt32);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_68,NAME_Bool);
  PSymbolType::PSymbolType(pPVar4,&local_68,(PType *)TypeBool);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_6c,NAME_Float);
  PSymbolType::PSymbolType(pPVar4,&local_6c,(PType *)TypeFloat64);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_70,NAME_Double);
  PSymbolType::PSymbolType(pPVar4,&local_70,(PType *)TypeFloat64);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_74,NAME_Float32);
  PSymbolType::PSymbolType(pPVar4,&local_74,(PType *)TypeFloat32);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_78,NAME_Float64);
  PSymbolType::PSymbolType(pPVar4,&local_78,(PType *)TypeFloat64);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_7c,NAME_String);
  PSymbolType::PSymbolType(pPVar4,&local_7c,(PType *)TypeString);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_80,NAME_Name);
  PSymbolType::PSymbolType(pPVar4,&local_80,(PType *)TypeName);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_84,NAME_Sound);
  PSymbolType::PSymbolType(pPVar4,&local_84,(PType *)TypeSound);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_88,NAME_Color);
  PSymbolType::PSymbolType(pPVar4,&local_88,(PType *)TypeColor);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_8c,NAME_State);
  PSymbolType::PSymbolType(pPVar4,&local_8c,(PType *)TypeState);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_90,NAME_Vector2);
  PSymbolType::PSymbolType(pPVar4,&local_90,(PType *)TypeVector2);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  pPVar4 = (PSymbolType *)DObject::operator_new((DObject *)0x30,(size_t)pPVar4);
  FName::FName(&local_94,NAME_Vector3);
  PSymbolType::PSymbolType(pPVar4,&local_94,(PType *)TypeVector3);
  PSymbolTable::AddSymbol(&GlobalSymbols,(PSymbol *)pPVar4);
  return;
}

Assistant:

void PType::StaticInit()
{
	// Add types to the global symbol table.
	atterm(ReleaseGlobalSymbols);

	// Set up TypeTable hash keys.
	RUNTIME_CLASS(PErrorType)->TypeTableType = RUNTIME_CLASS(PErrorType);
	RUNTIME_CLASS(PVoidType)->TypeTableType = RUNTIME_CLASS(PVoidType);
	RUNTIME_CLASS(PInt)->TypeTableType = RUNTIME_CLASS(PInt);
	RUNTIME_CLASS(PBool)->TypeTableType = RUNTIME_CLASS(PBool);
	RUNTIME_CLASS(PFloat)->TypeTableType = RUNTIME_CLASS(PFloat);
	RUNTIME_CLASS(PString)->TypeTableType = RUNTIME_CLASS(PString);
	RUNTIME_CLASS(PName)->TypeTableType = RUNTIME_CLASS(PName);
	RUNTIME_CLASS(PSound)->TypeTableType = RUNTIME_CLASS(PSound);
	RUNTIME_CLASS(PSpriteID)->TypeTableType = RUNTIME_CLASS(PSpriteID);
	RUNTIME_CLASS(PTextureID)->TypeTableType = RUNTIME_CLASS(PTextureID);
	RUNTIME_CLASS(PColor)->TypeTableType = RUNTIME_CLASS(PColor);
	RUNTIME_CLASS(PPointer)->TypeTableType = RUNTIME_CLASS(PPointer);
	RUNTIME_CLASS(PClassPointer)->TypeTableType = RUNTIME_CLASS(PClassPointer);
	RUNTIME_CLASS(PEnum)->TypeTableType = RUNTIME_CLASS(PEnum);
	RUNTIME_CLASS(PArray)->TypeTableType = RUNTIME_CLASS(PArray);
	RUNTIME_CLASS(PDynArray)->TypeTableType = RUNTIME_CLASS(PDynArray);
	RUNTIME_CLASS(PMap)->TypeTableType = RUNTIME_CLASS(PMap);
	RUNTIME_CLASS(PStruct)->TypeTableType = RUNTIME_CLASS(PStruct);
	RUNTIME_CLASS(PNativeStruct)->TypeTableType = RUNTIME_CLASS(PNativeStruct);
	RUNTIME_CLASS(PPrototype)->TypeTableType = RUNTIME_CLASS(PPrototype);
	RUNTIME_CLASS(PClass)->TypeTableType = RUNTIME_CLASS(PClass);
	RUNTIME_CLASS(PStatePointer)->TypeTableType = RUNTIME_CLASS(PStatePointer);
	RUNTIME_CLASS(PStateLabel)->TypeTableType = RUNTIME_CLASS(PStateLabel);

	// Create types and add them type the type table.
	TypeTable.AddType(TypeError = new PErrorType);
	TypeTable.AddType(TypeAuto = new PErrorType(2));
	TypeTable.AddType(TypeVoid = new PVoidType);
	TypeTable.AddType(TypeSInt8 = new PInt(1, false));
	TypeTable.AddType(TypeUInt8 = new PInt(1, true));
	TypeTable.AddType(TypeSInt16 = new PInt(2, false));
	TypeTable.AddType(TypeUInt16 = new PInt(2, true));
	TypeTable.AddType(TypeSInt32 = new PInt(4, false));
	TypeTable.AddType(TypeUInt32 = new PInt(4, true));
	TypeTable.AddType(TypeBool = new PBool);
	TypeTable.AddType(TypeFloat32 = new PFloat(4));
	TypeTable.AddType(TypeFloat64 = new PFloat(8));
	TypeTable.AddType(TypeString = new PString);
	TypeTable.AddType(TypeName = new PName);
	TypeTable.AddType(TypeSound = new PSound);
	TypeTable.AddType(TypeColor = new PColor);
	TypeTable.AddType(TypeState = new PStatePointer);
	TypeTable.AddType(TypeStateLabel = new PStateLabel);
	TypeTable.AddType(TypeNullPtr = new PPointer);
	TypeTable.AddType(TypeSpriteID = new PSpriteID);
	TypeTable.AddType(TypeTextureID = new PTextureID);

	TypeColorStruct = NewStruct("@ColorStruct", nullptr);	//This name is intentionally obfuscated so that it cannot be used explicitly. The point of this type is to gain access to the single channels of a color value.
	TypeStringStruct = NewNativeStruct(NAME_String, nullptr);
#ifdef __BIG_ENDIAN__
	TypeColorStruct->AddField(NAME_a, TypeUInt8);
	TypeColorStruct->AddField(NAME_r, TypeUInt8);
	TypeColorStruct->AddField(NAME_g, TypeUInt8);
	TypeColorStruct->AddField(NAME_b, TypeUInt8);
#else
	TypeColorStruct->AddField(NAME_b, TypeUInt8);
	TypeColorStruct->AddField(NAME_g, TypeUInt8);
	TypeColorStruct->AddField(NAME_r, TypeUInt8);
	TypeColorStruct->AddField(NAME_a, TypeUInt8);
#endif

	TypeVector2 = new PStruct(NAME_Vector2, nullptr);
	TypeVector2->AddField(NAME_X, TypeFloat64);
	TypeVector2->AddField(NAME_Y, TypeFloat64);
	TypeTable.AddType(TypeVector2);
	TypeVector2->loadOp = OP_LV2;
	TypeVector2->storeOp = OP_SV2;
	TypeVector2->moveOp = OP_MOVEV2;
	TypeVector2->RegType = REGT_FLOAT;
	TypeVector2->RegCount = 2;

	TypeVector3 = new PStruct(NAME_Vector3, nullptr);
	TypeVector3->AddField(NAME_X, TypeFloat64);
	TypeVector3->AddField(NAME_Y, TypeFloat64);
	TypeVector3->AddField(NAME_Z, TypeFloat64);
	// allow accessing xy as a vector2. This is not supposed to be serialized so it's marked transient
	TypeVector3->Symbols.AddSymbol(new PField(NAME_XY, TypeVector2, VARF_Transient, 0));
	TypeTable.AddType(TypeVector3);
	TypeVector3->loadOp = OP_LV3;
	TypeVector3->storeOp = OP_SV3;
	TypeVector3->moveOp = OP_MOVEV3;
	TypeVector3->RegType = REGT_FLOAT;
	TypeVector3->RegCount = 3;



	GlobalSymbols.AddSymbol(new PSymbolType(NAME_sByte, TypeSInt8));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Byte, TypeUInt8));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Short, TypeSInt16));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_uShort, TypeUInt16));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Int, TypeSInt32));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_uInt, TypeUInt32));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Bool, TypeBool));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Float, TypeFloat64));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Double, TypeFloat64));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Float32, TypeFloat32));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Float64, TypeFloat64));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_String, TypeString));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Name, TypeName));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Sound, TypeSound));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Color, TypeColor));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_State, TypeState));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Vector2, TypeVector2));
	GlobalSymbols.AddSymbol(new PSymbolType(NAME_Vector3, TypeVector3));
}